

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O0

String * __thiscall
Diligent::BasicFile::GetOpenModeStr_abi_cxx11_(String *__return_storage_ptr__,BasicFile *this)

{
  BasicFile *this_local;
  string *OpenModeStr;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((this->m_OpenAttribs).AccessMode) {
  case Read:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'r');
    break;
  case Overwrite:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'w');
    break;
  case Append:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'a');
    break;
  case ReadUpdate:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"r+");
    break;
  case OverwriteUpdate:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"w+");
    break;
  case AppendUpdate:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"a+");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'b');
  return __return_storage_ptr__;
}

Assistant:

String BasicFile::GetOpenModeStr()
{
    std::string OpenModeStr;
    switch (m_OpenAttribs.AccessMode)
    {
        // clang-format off
        case EFileAccessMode::Read:            OpenModeStr += 'r'; break;
        case EFileAccessMode::Overwrite:       OpenModeStr += 'w'; break;
        case EFileAccessMode::Append:          OpenModeStr += 'a'; break;
        case EFileAccessMode::ReadUpdate:      OpenModeStr += "r+"; break;
        case EFileAccessMode::OverwriteUpdate: OpenModeStr += "w+"; break;
        case EFileAccessMode::AppendUpdate:    OpenModeStr += "a+"; break;
        // clang-format on
        default: break;
    }

    // Always open file in binary mode. Text mode is platform-specific
    OpenModeStr += 'b';

    return OpenModeStr;
}